

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int ftp_file_exist(char *filename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *__stream;
  ssize_t sVar7;
  FILE *__stream_00;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  bool bVar12;
  int port;
  int tmpint;
  char ip [100];
  char host [100];
  char proto [100];
  char tmpstr [1200];
  char recbuf [1200];
  char fn [1200];
  char turl [1200];
  int local_1464;
  char *local_1460;
  char *local_1458;
  int local_144c;
  char local_1448 [112];
  char local_13d8 [112];
  char local_1368 [112];
  char local_12f8 [1200];
  char local_e48;
  char local_e47;
  char local_e46;
  char local_998;
  undefined1 local_997 [1199];
  char local_4e8 [1208];
  
  sVar5 = strlen(filename);
  if (0x4a9 < sVar5) {
    pcVar10 = "ftp filename is too long (ftp_file_exist)";
LAB_00137993:
    ffpmsg(pcVar10);
    return 0;
  }
  builtin_strncpy(local_4e8,"ftp://",7);
  strcat(local_4e8,filename);
  pcVar10 = local_13d8;
  iVar1 = NET_ParseUrl(local_4e8,local_1368,pcVar10,&local_1464,&local_998);
  if (iVar1 != 0) {
    snprintf(&local_e48,0x4b0,"URL Parse Error (ftp_file_exist) %s",filename);
    ffpmsg(&local_e48);
    return 0;
  }
  local_1464 = 0x15;
  pcVar6 = strrchr(pcVar10,0x40);
  if (pcVar6 == (char *)0x0) {
    local_1460 = "user@host.com";
    local_1458 = "anonymous";
  }
  else {
    *pcVar6 = '\0';
    pcVar10 = pcVar6 + 1;
    local_1460 = strchr(local_13d8,0x3a);
    local_1458 = local_13d8;
    if (local_1460 == (char *)0x0) {
      local_1460 = "user@host.com";
    }
    else {
      *local_1460 = '\0';
      local_1460 = local_1460 + 1;
    }
  }
  uVar11 = 0;
  bVar12 = true;
  do {
    iVar1 = NET_TcpConnect(pcVar10,local_1464);
    __stream = fdopen(iVar1,"r");
    if (__stream == (FILE *)0x0) {
      pcVar10 = "Failed to convert socket to stdio file (ftp_file_exist)";
      goto LAB_00137993;
    }
    iVar2 = ftp_status((FILE *)__stream,"220");
    if (iVar2 == 0) break;
    ffpmsg("error connecting to remote server, no 220 seen (ftp_file_exist)");
    fclose(__stream);
    if (-1 < iVar1) {
      uVar9 = 0;
      do {
        sVar7 = send(iVar1,"QUIT\r\n" + uVar9,(long)(6 - (int)uVar9),0);
        if ((int)sVar7 < 1) break;
        uVar8 = (int)uVar9 + (int)sVar7;
        uVar9 = (ulong)uVar8;
      } while ((int)uVar8 < 6);
    }
    sleep(5);
    bVar12 = uVar11 < 9;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 10);
  if (!bVar12) {
    pcVar10 = "error connecting to remote server, no 220 seen (ftp_open_network)";
    goto LAB_00137993;
  }
  pcVar10 = local_1458;
  snprintf(local_12f8,0x4b0,"USER %s\r\n");
  iVar2 = (int)pcVar10;
  sVar5 = strlen(local_12f8);
  NET_SendRaw(iVar1,local_12f8,(int)sVar5,iVar2);
  iVar2 = ftp_status((FILE *)__stream,"331 ");
  if (iVar2 != 0) {
    if (iVar2 == 0x226) {
      ffpmsg("Server is requesting SSL, will switch to ftps (ftp_file_exist)");
      fclose(__stream);
      if (iVar1 < 0) {
        return -1;
      }
      uVar9 = 0;
      do {
        sVar7 = send(iVar1,"QUIT\r\n" + uVar9,(long)(6 - (int)uVar9),0);
        if ((int)sVar7 < 1) {
          return -1;
        }
        uVar11 = (int)uVar9 + (int)sVar7;
        uVar9 = (ulong)uVar11;
      } while ((int)uVar11 < 6);
      return -1;
    }
    ffpmsg("USER error no 331 seen (ftp_file_exist)");
    fclose(__stream);
    if (iVar1 < 0) {
      return 0;
    }
    uVar9 = 0;
    do {
      sVar7 = send(iVar1,"QUIT\r\n" + uVar9,(long)(6 - (int)uVar9),0);
      if ((int)sVar7 < 1) {
        return 0;
      }
      uVar11 = (int)uVar9 + (int)sVar7;
      uVar9 = (ulong)uVar11;
    } while ((int)uVar11 < 6);
    return 0;
  }
  pcVar10 = local_1460;
  snprintf(local_12f8,0x4b0,"PASS %s\r\n");
  iVar2 = (int)pcVar10;
  sVar5 = strlen(local_12f8);
  NET_SendRaw(iVar1,local_12f8,(int)sVar5,iVar2);
  iVar3 = ftp_status((FILE *)__stream,"230 ");
  if (iVar3 == 0) {
    pcVar10 = &local_998;
    pcVar6 = strrchr(pcVar10,0x2f);
    if (pcVar6 == (char *)0x0) {
      builtin_strncpy(local_12f8,"CWD /\r\n",8);
    }
    else {
      *pcVar6 = '\0';
      pcVar10 = pcVar6 + 1;
      if (local_998 == '/') {
        iVar2 = (int)local_997;
      }
      else {
        if (local_998 == '\0') {
          builtin_strncpy(local_12f8,"CWD /\r\n",8);
          goto LAB_00137d54;
        }
        iVar2 = (int)&local_998;
      }
      snprintf(local_12f8,0x4b0,"CWD %s\r\n");
    }
LAB_00137d54:
    sVar5 = strlen(local_12f8);
    NET_SendRaw(iVar1,local_12f8,(int)sVar5,iVar2);
    iVar3 = ftp_status((FILE *)__stream,"250 ");
    if (iVar3 != 0) {
      pcVar10 = "CWD error, no 250 seen (ftp_file_exist)";
      goto LAB_00137d8a;
    }
    if (*pcVar10 == '\0') {
LAB_0013807b:
      pcVar10 = "Null file name (ftp_file_exist)";
      goto LAB_00137d8a;
    }
    builtin_strncpy(local_12f8,"TYPE I\r\n",9);
    sVar5 = strlen(local_12f8);
    NET_SendRaw(iVar1,local_12f8,(int)sVar5,iVar2);
    iVar3 = ftp_status((FILE *)__stream,"200 ");
    if (iVar3 != 0) {
      pcVar10 = "TYPE I error, 200 not seen (ftp_file_exist)";
      goto LAB_00137d8a;
    }
    NET_SendRaw(iVar1,"PASV\r\n",6,iVar2);
    pcVar6 = fgets(&local_e48,0x4b0,__stream);
    if (pcVar6 == (char *)0x0) {
LAB_00138087:
      pcVar10 = "PASV error (ftp_file_exist)";
      goto LAB_00137d8a;
    }
    if (((local_e48 == '2') && (local_e47 == '2')) && (local_e46 == '7')) {
      pcVar6 = strchr(&local_e48,0x28);
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = '\0';
        local_1448[0] = '\0';
        pcVar6 = strtok(pcVar6 + 1,",)");
        if (pcVar6 != (char *)0x0) {
          strcpy(local_1448,pcVar6);
          sVar5 = strlen(local_1448);
          (local_1448 + sVar5)[0] = '.';
          (local_1448 + sVar5)[1] = '\0';
          pcVar6 = strtok((char *)0x0,",)");
          if (pcVar6 != (char *)0x0) {
            strcat(local_1448,pcVar6);
            sVar5 = strlen(local_1448);
            (local_1448 + sVar5)[0] = '.';
            (local_1448 + sVar5)[1] = '\0';
            pcVar6 = strtok((char *)0x0,",)");
            if (pcVar6 != (char *)0x0) {
              strcat(local_1448,pcVar6);
              sVar5 = strlen(local_1448);
              (local_1448 + sVar5)[0] = '.';
              (local_1448 + sVar5)[1] = '\0';
              pcVar6 = strtok((char *)0x0,",)");
              if (pcVar6 != (char *)0x0) {
                strcat(local_1448,pcVar6);
                pcVar6 = strtok((char *)0x0,",)");
                if (pcVar6 != (char *)0x0) {
                  __isoc99_sscanf(pcVar6,"%d",&local_1464);
                  local_1464 = local_1464 << 8;
                  pcVar6 = strtok((char *)0x0,",)");
                  if (pcVar6 != (char *)0x0) {
                    __isoc99_sscanf(pcVar6,"%d",&local_144c);
                    local_1464 = local_1464 + local_144c;
                    if (*pcVar10 != '\0') {
                      iVar3 = NET_TcpConnect(local_1448,local_1464);
                      __stream_00 = fdopen(iVar3,"r");
                      if (__stream_00 == (FILE *)0x0) {
                        ffpmsg("Could not connect to passive port (ftp_file_exist)");
                        fclose(__stream);
                        NET_SendRaw(iVar1,"QUIT\r\n",6,iVar2);
                        return 0;
                      }
                      snprintf(local_12f8,0x4b0,"RETR %s\r\n");
                      iVar2 = (int)pcVar10;
                      sVar5 = strlen(local_12f8);
                      NET_SendRaw(iVar1,local_12f8,(int)sVar5,iVar2);
                      iVar4 = ftp_status((FILE *)__stream,"150 ");
                      uVar11 = (uint)(iVar4 == 0);
                      fclose(__stream_00);
                      NET_SendRaw(iVar3,"QUIT\r\n",6,iVar2);
                      fclose(__stream);
                      goto LAB_00137da0;
                    }
                    goto LAB_0013807b;
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00138087;
    }
  }
  else {
    pcVar10 = "PASS error, no 230 seen (ftp_file_exist)";
LAB_00137d8a:
    ffpmsg(pcVar10);
  }
  uVar11 = 0;
  fclose(__stream);
LAB_00137da0:
  NET_SendRaw(iVar1,"QUIT\r\n",6,iVar2);
  return uVar11;
}

Assistant:

int ftp_file_exist(char *filename)
{
  FILE *ftpfile;
  FILE *command;
  int sock;
  int status;
  int sock1;
  int tmpint;
  char recbuf[MAXLEN];
  char errorstr[MAXLEN];
  char tmpstr[MAXLEN];
  char proto[SHORTLEN];
  char host[SHORTLEN];
  char *newhost;
  char *username;
  char *password;
  char fn[MAXLEN];
  char *newfn;
  char *passive;
  char *tstr;
  char *saveptr;
  char ip[SHORTLEN];
  char turl[MAXLEN];
  int port;
  int ii, tryingtologin = 1;

  /* parse the URL */
  if (strlen(filename) > MAXLEN - 7) {
    ffpmsg("ftp filename is too long (ftp_file_exist)");
    return 0;
  }

  strcpy(turl,"ftp://");
  strcat(turl,filename);
  if (NET_ParseUrl(turl,proto,host,&port,fn)) {
    snprintf(errorstr,MAXLEN,"URL Parse Error (ftp_file_exist) %s",filename);
    ffpmsg(errorstr);
    return 0;
  }

  port = 21;
  /* we might have a user name */
  username = "anonymous";
  password = "user@host.com";
  /* is there an @ sign */
  if (NULL != (newhost = strrchr(host,'@'))) {
    *newhost = '\0'; /* make it a null, */
    newhost++; /* Now newhost points to the host name and host points to the 
		  user name, password combo */
    username = host;
    /* is there a : for a password */
    if (NULL != strchr(username,':')) {
      password = strchr(username,':');
      *password = '\0';
      password++;
    }
  } else {
    newhost = host;
  }

  for (ii = 0; ii < 10; ii++) {  /* make up to 10 attempts to log in */
  
  /* Connect to the host on the required port */
  sock = NET_TcpConnect(newhost,port);
  /* convert it to a stdio file */
  if (NULL == (command = fdopen(sock,"r"))) {
    ffpmsg ("Failed to convert socket to stdio file (ftp_file_exist)");
    return 0;
  }

  /* Wait for the 220 response */
  if (ftp_status(command,"220")) {
    ffpmsg ("error connecting to remote server, no 220 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);

/*    ffpmsg("sleeping for 5 in ftp_file_exist, then try again"); */

    sleep (5);  /* take a nap and hope ftp server sorts itself out in the meantime */

  } else {
    tryingtologin = 0;
    break;
  }
  
  }  

  if (tryingtologin) { /* the 10 attempts were not successful */
     ffpmsg ("error connecting to remote server, no 220 seen (ftp_open_network)");
     return (0);
  }
 
  /* Send the user name and wait for the right response */
  snprintf(tmpstr,MAXLEN,"USER %s\r\n",username);

  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  /* If command is refused due to the connection requiring SSL (ie. an
     fpts connection), this is where it will first be detected by way
     of a 550 error code. */
     
  status = ftp_status(command,"331 ");
  if (status == 550)
  {
    ffpmsg ("Server is requesting SSL, will switch to ftps (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return -1;
  }
  else if (status) {
    ffpmsg ("USER error no 331 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  /* Send the password and wait for the right response */
  snprintf(tmpstr,MAXLEN,"PASS %s\r\n",password);
  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"230 ")) {
    ffpmsg ("PASS error, no 230 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  /* now do the cwd command */
  newfn = strrchr(fn,'/');
  if (newfn == NULL) {
    strcpy(tmpstr,"CWD /\r\n");
    newfn = fn;
  } else {
    *newfn = '\0';
    newfn++;
    if (strlen(fn) == 0) {
      strcpy(tmpstr,"CWD /\r\n");
    } else {
      /* remove the leading slash */
      if (fn[0] == '/') {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",&fn[1]);
      } else {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",fn);
      } 
    }
  }

  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"250 ")) {
    ffpmsg ("CWD error, no 250 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  if (!strlen(newfn)) {
    ffpmsg("Null file name (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  /* Always use binary mode */
  snprintf(tmpstr,MAXLEN,"TYPE I\r\n");
  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"200 ")) {
    ffpmsg ("TYPE I error, 200 not seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  status = NET_SendRaw(sock,"PASV\r\n",6,NET_DEFAULT);

  if (!(fgets(recbuf,MAXLEN,command))) {
    ffpmsg ("PASV error (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  /*  Passive mode response looks like
      227 Entering Passive Mode (129,194,67,8,210,80) */
  if (recbuf[0] == '2' && recbuf[1] == '2' && recbuf[2] == '7') {
    /* got a good passive mode response, find the opening ( */
    
    if (!(passive = strchr(recbuf,'('))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    
    *passive = '\0';
    passive++;
    ip[0] = '\0';
      
    /* Messy parsing of response from PASV command */
    
    if (!(tstr = ffstrtok(passive,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcpy(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    
    /* Done the ip number, now do the port # */
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    sscanf(tstr,"%d",&port);
    port *= 256;
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    sscanf(tstr,"%d",&tmpint);
    port += tmpint;

    if (!strlen(newfn)) {
      ffpmsg("Null file name (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }

    /* Connect to the data port */
    sock1 = NET_TcpConnect(ip,port);
    if (NULL == (ftpfile = fdopen(sock1,"r"))) {
      ffpmsg ("Could not connect to passive port (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }

    /* Send the retrieve command */
    snprintf(tmpstr,MAXLEN,"RETR %s\r\n",newfn);
    status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

    if (ftp_status(command,"150 ")) {
      fclose(ftpfile); 
      NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    
    /* if we got here then the file probably exists */

    fclose(ftpfile); 
    NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
    fclose(command); 
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 1;
  }
  
  /* no passive mode */

  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  return 0;
}